

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_>::MidSideNodeIndices
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>_> *this,int side,
          TPZVec<long> *indices)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  TPZGeoElSideIndex *this_00;
  int64_t iVar4;
  long *plVar5;
  long lVar6;
  TPZVec<long> *in_RDX;
  int in_ESI;
  long *in_RDI;
  TPZGeoEl *subel;
  int64_t counter;
  int64_t is;
  int64_t nsub;
  TPZVec<TPZGeoElSideIndex> nodeIndexes;
  TPZManVector<TPZGeoElSide,_10> gelsides;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  TPZVec<TPZGeoElSideIndex> *in_stack_fffffffffffffe40;
  TPZVec<TPZGeoElSideIndex> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  int side_00;
  long index;
  TPZRefPattern *in_stack_fffffffffffffe90;
  long index_00;
  TPZAutoPointer<TPZRefPattern> local_160 [3];
  _func_int **in_stack_fffffffffffffeb8;
  TPZGeoElSideIndex *in_stack_fffffffffffffec0;
  
  side_00 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x385));
  if (((bVar1) && (iVar2 = (**(code **)(*in_RDI + 0x1d0))(), iVar2 != 0)) &&
     (iVar2 = (**(code **)(*in_RDI + 0x98))(), iVar2 <= in_ESI)) {
    TPZManVector<TPZGeoElSide,_10>::TPZManVector
              ((TPZManVector<TPZGeoElSide,_10> *)in_stack_fffffffffffffec0,
               (int64_t)in_stack_fffffffffffffeb8);
    TPZVec<TPZGeoElSideIndex>::TPZVec((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8);
    (**(code **)(*in_RDI + 0x2b0))(local_160);
    TPZAutoPointer<TPZRefPattern>::operator->(local_160);
    TPZRefPattern::InternalNodesIndexes(in_stack_fffffffffffffe90,side_00,in_stack_fffffffffffffe80)
    ;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(in_stack_fffffffffffffe20);
    iVar3 = TPZVec<TPZGeoElSideIndex>::NElements
                      ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8);
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,iVar3);
    index = 0;
    for (index_00 = 0; index_00 < iVar3; index_00 = index_00 + 1) {
      this_00 = TPZVec<TPZGeoElSideIndex>::operator[]
                          ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8,index_00);
      iVar4 = TPZGeoElSideIndex::ElementIndex(this_00);
      plVar5 = (long *)(**(code **)(*in_RDI + 0x1f8))(in_RDI,(int)iVar4 + -1);
      in_stack_fffffffffffffe40 =
           (TPZVec<TPZGeoElSideIndex> *)
           TPZVec<TPZGeoElSideIndex>::operator[]
                     ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8,index_00);
      in_stack_fffffffffffffe34 =
           TPZGeoElSideIndex::Side((TPZGeoElSideIndex *)in_stack_fffffffffffffe40);
      lVar6 = (**(code **)(*plVar5 + 0xa8))(plVar5,in_stack_fffffffffffffe34);
      plVar5 = TPZVec<long>::operator[](in_RDX,index);
      *plVar5 = lVar6;
      index = index + 1;
    }
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,index);
    TPZVec<TPZGeoElSideIndex>::~TPZVec(in_stack_fffffffffffffe40);
    TPZManVector<TPZGeoElSide,_10>::~TPZManVector
              ((TPZManVector<TPZGeoElSide,_10> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  }
  else {
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,0);
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndices(int side,TPZVec<int64_t> &indices) const{
	if(!fRefPattern || !HasSubElement() || side < this->NCornerNodes()) {
		indices.Resize(0);
		return;
	}
	TPZManVector<TPZGeoElSide> gelsides;
	TPZVec<TPZGeoElSideIndex> nodeIndexes;
	this->GetRefPattern()->InternalNodesIndexes(side, nodeIndexes);
	
	int64_t nsub = nodeIndexes.NElements();
	indices.Resize(nsub);
	int64_t is;
	int64_t counter = 0;
	for(is=0; is<nsub; is++)
	{
		TPZGeoEl *subel = SubElement(nodeIndexes[is].ElementIndex() - 1);
		indices[counter] = subel->NodeIndex(nodeIndexes[is].Side());
		counter++;
	}
	indices.Resize(counter);
}